

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O1

int lyb_parse_schema_hash
              (lys_node *sparent,lys_module *mod,char *data,char *yang_data_name,int options,
              lys_node **snode,lyb_state *lybs)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  lys_node *plVar5;
  uint uVar6;
  ulong uVar7;
  LY_VLOG_ELEM elem_type;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  byte bVar11;
  lys_node *plVar12;
  ulong uVar13;
  byte local_3b [7];
  int iStack_34;
  uint8_t hash [7];
  
  iStack_34 = options;
  if ((sparent == (lys_node *)0x0) != (mod != (lys_module *)0x0)) {
    __assert_fail("(sparent || mod) && (!sparent || !mod)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                  ,0x38a,
                  "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                 );
  }
  uVar2 = lyb_read(data,local_3b,1,lybs);
  if ((int)uVar2 < 0) {
    return -1;
  }
  uVar13 = 0;
  if (-1 < (char)local_3b[0]) {
    do {
      if ((int)uVar13 == 9) {
        return -1;
      }
      bVar11 = (byte)uVar13;
      uVar6 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar6;
    } while (((uint)local_3b[0] << (bVar11 & 0x1f) & 0x40) == 0);
    uVar13 = (ulong)uVar6;
  }
  uVar7 = uVar13 & 0xff;
  local_3b[uVar7] = local_3b[0];
  if ((char)uVar13 != '\0') {
    pcVar9 = data + uVar2;
    do {
      uVar10 = ((uint)uVar13 & 0xff) - 1;
      uVar6 = lyb_read(pcVar9,local_3b + uVar10,1,lybs);
      if ((int)uVar6 < 0) {
        return -1;
      }
      bVar11 = local_3b[uVar10];
      if (-1 < (char)(bVar11 << ((byte)uVar10 & 0x1f))) {
        __assert_fail("hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                      ,0x3a0,
                      "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                     );
      }
      if ((bVar11 >> (9U - (char)uVar13 & 0x1f) & 0x7f) != 0) {
        __assert_fail("!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1))))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser_lyb.c"
                      ,0x3a2,
                      "int lyb_parse_schema_hash(const struct lys_node *, const struct lys_module *, const char *, const char *, int, struct lys_node **, struct lyb_state *)"
                     );
      }
      uVar2 = uVar2 + uVar6;
      pcVar9 = pcVar9 + uVar6;
      bVar11 = (char)uVar13 - 1;
      uVar13 = (ulong)bVar11;
    } while (bVar11 != 0);
  }
  if (((mod == (lys_module *)0x0) || (yang_data_name == (char *)0x0)) ||
     ((iStack_34 & 0x1000000U) == 0)) {
LAB_001454c6:
    if (sparent == (lys_node *)0x0) {
      plVar5 = (lys_node *)0x0;
    }
    else {
      plVar5 = sparent;
      if ((sparent->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) {
        plVar12 = (lys_node *)0x0;
        plVar5 = (lys_node *)0x0;
        do {
          plVar5 = lys_getnext(plVar5,sparent,(lys_module *)0x0,8);
          if (plVar5 == (lys_node *)0x0) goto LAB_001455a7;
        } while ((((byte)iStack_34 >> 4 & plVar5->nodetype == LYS_INPUT) == 0) &&
                ((iStack_34 & 0x20U) == 0 || plVar5->nodetype != LYS_OUTPUT));
      }
    }
    sparent = plVar5;
    plVar5 = lys_getnext((lys_node *)0x0,sparent,mod,0);
    plVar12 = (lys_node *)0x0;
    if (plVar5 == (lys_node *)0x0) goto LAB_001455a7;
    do {
      iVar3 = lyb_has_schema_model(plVar5,lybs->models,lybs->mod_count);
      if (iVar3 != 0) {
        uVar13 = 0;
        do {
          bVar11 = lyb_hash(plVar5,(uint8_t)uVar13);
          pbVar1 = local_3b + uVar13;
          if (uVar7 == uVar13) break;
          uVar13 = uVar13 + 1;
        } while (bVar11 == *pbVar1);
        plVar12 = plVar5;
        if (bVar11 == *pbVar1) goto LAB_001455a7;
      }
      plVar5 = lys_getnext(plVar5,sparent,mod,0);
    } while (plVar5 != (lys_node *)0x0);
  }
  else {
    sVar4 = strlen(yang_data_name);
    sparent = lyp_get_yang_data_template(mod,yang_data_name,(int)sVar4);
    if (sparent != (lys_node *)0x0) goto LAB_001454c6;
    sparent = (lys_node *)0x0;
  }
  plVar12 = (lys_node *)0x0;
LAB_001455a7:
  *snode = plVar12;
  if ((((uint)iStack_34 >> 9 & 1) != 0) && (plVar12 == (lys_node *)0x0)) {
    if (mod == (lys_module *)0x0) {
      pcVar9 = sparent->name;
      pcVar8 = "Failed to find matching hash for a child of \"%s\".";
      elem_type = LY_VLOG_LYS;
    }
    else {
      pcVar9 = mod->name;
      pcVar8 = "Failed to find matching hash for a top-level node from \"%s\".";
      elem_type = LY_VLOG_NONE;
      sparent = (lys_node *)0x0;
    }
    uVar2 = 0xffffffff;
    ly_vlog(lybs->ctx,LYE_SPEC,elem_type,sparent,pcVar8,pcVar9);
  }
  return uVar2;
}

Assistant:

static int
lyb_parse_schema_hash(const struct lys_node *sparent, const struct lys_module *mod, const char *data, const char *yang_data_name,
                      int options, struct lys_node **snode, struct lyb_state *lybs)
{
    int r, ret = 0;
    uint8_t i, j;
    struct lys_node *sibling;
    LYB_HASH hash[LYB_HASH_BITS - 1];

    assert((sparent || mod) && (!sparent || !mod));

    /* read the first hash */
    ret += (r = lyb_read(data, &hash[0], sizeof *hash, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    /* based on the first hash read all the other ones, if any */
    for (i = 0; !(hash[0] & (LYB_HASH_COLLISION_ID >> i)); ++i) {
        if (i > LYB_HASH_BITS) {
            return -1;
        }
    }

    /* move the first hash on its accurate position */
    hash[i] = hash[0];

    /* read the rest of hashes */
    for (j = i; j; --j) {
        ret += (r = lyb_read(data, &hash[j - 1], sizeof *hash, lybs));
        LYB_HAVE_READ_RETURN(r, data, -1);

        /* correct collision ID */
        assert(hash[j - 1] & (LYB_HASH_COLLISION_ID >> (j - 1)));
        /* preceded with zeros */
        assert(!(hash[j - 1] & (LYB_HASH_MASK << (LYB_HASH_BITS - (j - 1)))));
    }

    /* handle yang data templates */
    if ((options & LYD_OPT_DATA_TEMPLATE) && yang_data_name && mod) {
        sparent = lyp_get_yang_data_template(mod, yang_data_name, strlen(yang_data_name));
        if (!sparent) {
            sibling = NULL;
            goto finish;
        }
    }

    /* handle RPC/action input/output */
    if (sparent && (sparent->nodetype & (LYS_RPC | LYS_ACTION))) {
        sibling = NULL;
        while ((sibling = (struct lys_node *)lys_getnext(sibling, sparent, NULL, LYS_GETNEXT_WITHINOUT))) {
            if ((sibling->nodetype == LYS_INPUT) && (options & LYD_OPT_RPC)) {
                break;
            }
            if ((sibling->nodetype == LYS_OUTPUT) && (options & LYD_OPT_RPCREPLY)) {
                break;
            }
        }
        if (!sibling) {
            /* fail */
            goto finish;
        }

        /* use only input/output children nodes */
        sparent = sibling;
    }

    /* find our node with matching hashes */
    sibling = NULL;
    while ((sibling = (struct lys_node *)lys_getnext(sibling, sparent, mod, 0))) {
        /* skip schema nodes from models not present during printing */
        if (lyb_has_schema_model(sibling, lybs->models, lybs->mod_count) && lyb_is_schema_hash_match(sibling, hash, i + 1)) {
            /* match found */
            break;
        }
    }

finish:
    *snode = sibling;
    if (!sibling && (options & LYD_OPT_STRICT)) {
        if (mod) {
            LOGVAL(lybs->ctx, LYE_SPEC, LY_VLOG_NONE, NULL, "Failed to find matching hash for a top-level node from \"%s\".",
                    mod->name);
        } else {
            LOGVAL(lybs->ctx, LYE_SPEC, LY_VLOG_LYS, sparent, "Failed to find matching hash for a child of \"%s\".",
                    sparent->name);
        }
        return -1;
    }

    return ret;
}